

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<__int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  unsigned_type *puVar1;
  char *pcVar2;
  char cVar3;
  ulong uVar4;
  num_writer f;
  undefined1 auVar5 [16];
  unsigned_type uVar6;
  char cVar7;
  int iVar8;
  _Alloc_hider _Var9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  string_view prefix;
  undefined1 auVar14 [16];
  string groups;
  string local_88;
  ulong local_68;
  ulong uStack_60;
  int local_58;
  undefined4 uStack_54;
  string *psStack_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  
  grouping_impl<char>(&local_88,(locale_ref)(this->writer->locale_).locale_);
  if (local_88._M_string_length == 0) {
    on_dec(this);
    goto LAB_0013f59d;
  }
  cVar7 = thousands_sep_impl<char>((locale_ref)(this->writer->locale_).locale_);
  if (cVar7 == '\0') {
    on_dec(this);
    goto LAB_0013f59d;
  }
  puVar1 = &this->abs_value;
  uVar6 = *puVar1;
  uVar4 = *(ulong *)((long)&this->abs_value + 8);
  auVar14 = (undefined1  [16])*puVar1;
  auVar5 = (undefined1  [16])*puVar1;
  iVar12 = 1;
  if (((ulong)uVar6 < 10) <= uVar4) {
    iVar10 = 4;
    do {
      iVar12 = iVar10;
      uVar11 = auVar14._8_8_;
      uVar13 = auVar14._0_8_;
      if (uVar11 == 0 && (ulong)(99 < uVar13) <= -uVar11) {
        iVar12 = iVar12 + -2;
        goto LAB_0013f4e6;
      }
      if (uVar11 == 0 && (ulong)(999 < uVar13) <= -uVar11) {
        iVar12 = iVar12 + -1;
        goto LAB_0013f4e6;
      }
      if (uVar11 < (uVar13 < 10000)) goto LAB_0013f4e6;
      auVar14 = __udivti3(uVar13,uVar11,10000,0);
      iVar10 = iVar12 + 4;
    } while (uVar11 != 0 || -uVar11 < (ulong)(99999 < uVar13));
    iVar12 = iVar12 + 1;
  }
LAB_0013f4e6:
  psStack_50 = &local_88;
  pcVar2 = local_88._M_dataplus._M_p + local_88._M_string_length;
  _Var9._M_p = local_88._M_dataplus._M_p;
  iVar10 = iVar12;
  if (local_88._M_string_length == 0) {
LAB_0013f528:
    local_58 = iVar10;
    iVar8 = iVar12;
    if (_Var9._M_p == pcVar2) goto LAB_0013f532;
  }
  else {
    local_58 = (int)local_88._M_string_length + iVar12;
    do {
      cVar3 = *_Var9._M_p;
      iVar8 = iVar12 - cVar3;
      if ((iVar8 == 0 || iVar12 < cVar3) || ((byte)(cVar3 + 0x81U) < 0x82)) goto LAB_0013f528;
      iVar10 = iVar10 + 1;
      _Var9._M_p = _Var9._M_p + 1;
      local_88._M_string_length = local_88._M_string_length - 1;
      iVar12 = iVar8;
    } while (local_88._M_string_length != 0);
LAB_0013f532:
    local_58 = (iVar8 + -1) / (int)pcVar2[-1] + local_58;
  }
  f._20_4_ = uStack_54;
  f.size = local_58;
  f._33_7_ = uStack_47;
  f.sep = cVar7;
  f.abs_value = (unsigned_type)auVar5;
  f.groups = psStack_50;
  f._40_8_ = uStack_40;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  local_68 = (ulong)uVar6;
  uStack_60 = uVar4;
  local_48 = cVar7;
  basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
  ::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              *)this->writer,local_58,prefix,*this->specs,f);
LAB_0013f59d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }